

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_DESTRUCTION(effect_handler_context_t *context)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int y;
  int x;
  loc_conflict grid_00;
  loc grid2;
  loc_conflict grid_01;
  loc_conflict grid_02;
  loc_conflict grid_03;
  loc_conflict grid_04;
  loc_conflict grid_05;
  loc_conflict grid_06;
  loc grid1;
  loc_conflict grid_07;
  loc_conflict grid_08;
  loc_conflict grid_09;
  loc_conflict grid_10;
  loc_conflict grid_11;
  loc_conflict grid_12;
  loc_conflict grid_13;
  loc_conflict grid_14;
  player *ppVar3;
  _Bool _Var4;
  wchar_t wVar5;
  uint32_t uVar6;
  loc lVar7;
  square_conflict *psVar8;
  object *local_48;
  object *obj;
  wchar_t local_34;
  wchar_t wStack_30;
  loc_conflict grid;
  wchar_t px;
  wchar_t py;
  wchar_t elem;
  wchar_t r;
  wchar_t k;
  effect_handler_context_t *context_local;
  
  wVar1 = context->radius;
  wVar2 = context->subtype;
  y = (player->grid).y;
  x = (player->grid).x;
  context->ident = true;
  if ((player->depth == 0) || ((player->upkeep->arena_level & 1U) != 0)) {
    msg("The ground shakes for a moment.");
  }
  else {
    for (wStack_30 = y - wVar1; wStack_30 <= y + wVar1; wStack_30 = wStack_30 + L'\x01') {
      for (local_34 = x - wVar1; local_34 <= x + wVar1; local_34 = local_34 + L'\x01') {
        grid_00.y = wStack_30;
        grid_00.x = local_34;
        _Var4 = square_in_bounds_fully((chunk *)cave,grid_00);
        if (_Var4) {
          lVar7 = loc(x,y);
          grid2.y = wStack_30;
          grid2.x = local_34;
          wVar5 = distance(lVar7,grid2);
          if (wVar5 <= wVar1) {
            grid_01.y = wStack_30;
            grid_01.x = local_34;
            psVar8 = square((chunk *)cave,grid_01);
            flag_off(psVar8->info,3,4);
            grid_02.y = wStack_30;
            grid_02.x = local_34;
            psVar8 = square((chunk *)cave,grid_02);
            flag_off(psVar8->info,3,3);
            grid_03.y = wStack_30;
            grid_03.x = local_34;
            _Var4 = square_isbright((chunk *)cave,grid_03);
            if (!_Var4) {
              grid_04.y = wStack_30;
              grid_04.x = local_34;
              psVar8 = square((chunk *)cave,grid_04);
              flag_off(psVar8->info,3,2);
            }
            grid_05.y = wStack_30;
            grid_05.x = local_34;
            psVar8 = square((chunk *)cave,grid_05);
            flag_off(psVar8->info,3,5);
            grid_06.y = wStack_30;
            grid_06.x = local_34;
            square_forget((chunk *)cave,grid_06);
            lVar7.y = wStack_30;
            lVar7.x = local_34;
            square_light_spot((chunk *)cave,lVar7);
            grid1.y = wStack_30;
            grid1.x = local_34;
            _Var4 = loc_eq(grid1,player->grid);
            if (!_Var4) {
              grid_07.y = wStack_30;
              grid_07.x = local_34;
              delete_monster((chunk *)cave,grid_07);
              grid_08.y = wStack_30;
              grid_08.x = local_34;
              _Var4 = square_isstairs((chunk *)cave,grid_08);
              if ((!_Var4) &&
                 (grid_09.y = wStack_30, grid_09.x = local_34,
                 _Var4 = square_isperm((chunk *)cave,grid_09), !_Var4)) {
                grid_10.y = wStack_30;
                grid_10.x = local_34;
                for (local_48 = square_object((chunk *)cave,grid_10); local_48 != (object *)0x0;
                    local_48 = local_48->next) {
                  if (local_48->artifact != (artifact *)0x0) {
                    if ((((player->opts).opt[0x24] & 1U) != 0) ||
                       (_Var4 = obj_is_known_artifact(local_48), _Var4)) {
                      history_lose_artifact(player,local_48->artifact);
                      mark_artifact_created(local_48->artifact,true);
                    }
                    else {
                      mark_artifact_created(local_48->artifact,false);
                    }
                  }
                }
                grid_11.y = wStack_30;
                grid_11.x = local_34;
                square_excise_all_imagined((chunk *)player->cave,(chunk *)cave,grid_11);
                grid_12.y = wStack_30;
                grid_12.x = local_34;
                square_excise_pile((chunk *)player->cave,grid_12);
                grid_13.y = wStack_30;
                grid_13.x = local_34;
                square_excise_pile((chunk *)cave,grid_13);
                grid_14.y = wStack_30;
                grid_14.x = local_34;
                square_destroy((chunk *)cave,grid_14);
              }
            }
          }
        }
      }
    }
    if (wVar2 == L'\x05') {
      msg("There is a searing blast of light!");
      equip_learn_element(player,L'\x05');
      _Var4 = player_resists(player,L'\x05');
      ppVar3 = player;
      if (!_Var4) {
        uVar6 = Rand_div(10);
        player_inc_timed(ppVar3,L'\x02',uVar6 + L'\v',true,true,true);
      }
    }
    else if (wVar2 == L'\x06') {
      msg("Darkness seems to crush you!");
      equip_learn_element(player,L'\x06');
      _Var4 = player_resists(player,L'\x06');
      ppVar3 = player;
      if (!_Var4) {
        uVar6 = Rand_div(10);
        player_inc_timed(ppVar3,L'\x02',uVar6 + L'\v',true,true,true);
      }
    }
    player->upkeep->update = player->upkeep->update | 0x60;
    player->upkeep->redraw = player->upkeep->redraw | 0xc00000;
  }
  return true;
}

Assistant:

bool effect_handler_DESTRUCTION(effect_handler_context_t *context)
{
	int k, r = context->radius;
	int elem = context->subtype;
	int py = player->grid.y;
	int px = player->grid.x;
	struct loc grid;

	context->ident = true;

	/* No effect in town or arena */
	if ((!player->depth) || (player->upkeep->arena_level)) {
		msg("The ground shakes for a moment.");
		return true;
	}

	/* Big area of affect */
	for (grid.y = (py - r); grid.y <= (py + r); grid.y++) {
		for (grid.x = (px - r); grid.x <= (px + r); grid.x++) {
			/* Skip illegal grids */
			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Extract the distance */
			k = distance(loc(px, py), grid);

			/* Stay in the circle of death */
			if (k > r) continue;

			/* Lose room and vault */
			sqinfo_off(square(cave, grid)->info, SQUARE_ROOM);
			sqinfo_off(square(cave, grid)->info, SQUARE_VAULT);

			/* Forget completely */
			if (!square_isbright(cave, grid)) {
				sqinfo_off(square(cave, grid)->info, SQUARE_GLOW);
			}
			sqinfo_off(square(cave, grid)->info, SQUARE_SEEN);
			square_forget(cave, grid);
			square_light_spot(cave, grid);

			/* Deal with player later */
			if (loc_eq(grid, player->grid)) continue;

			/* Delete the monster (if any) */
			delete_monster(cave, grid);

			/* Don't remove stairs */
			if (square_isstairs(cave, grid)) continue;

			/* Destroy any grid that isn't a permament wall */
			if (!square_isperm(cave, grid)) {
				/* Deal with artifacts */
				struct object *obj = square_object(cave, grid);
				while (obj) {
					if (obj->artifact) {
						if (OPT(player, birth_lose_arts) ||
							obj_is_known_artifact(obj)) {
							history_lose_artifact(player, obj->artifact);
							mark_artifact_created(
								obj->artifact,
								true);
						} else {
							mark_artifact_created(
								obj->artifact,
								false);
						}
					}
					obj = obj->next;
				}

				/* Delete objects */
				square_excise_all_imagined(player->cave, cave,
					grid);
				square_excise_pile(player->cave, grid);
				square_excise_pile(cave, grid);
				square_destroy(cave, grid);
			}
		}
	}

	/* Player is affected */
	if (elem == ELEM_LIGHT) {
		msg("There is a searing blast of light!");
		equip_learn_element(player, ELEM_LIGHT);
		if (!player_resists(player, ELEM_LIGHT)) {
			(void)player_inc_timed(player, TMD_BLIND,
				10 + randint1(10), true, true, true);
		}
	} else if (elem == ELEM_DARK) {
		msg("Darkness seems to crush you!");
		equip_learn_element(player, ELEM_DARK);
		if (!player_resists(player, ELEM_DARK)) {
			(void)player_inc_timed(player, TMD_BLIND,
				10 + randint1(10), true, true, true);
		}
	}

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw monster list */
	player->upkeep->redraw |= (PR_MONLIST | PR_ITEMLIST);

	return true;
}